

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_set_covered(MultiFab *mf,int icomp,int ncomp,int ngrow,Real val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  FabFactory<amrex::FArrayBox> *pFVar7;
  FabArray<amrex::EBCellFlagFab> *this;
  int *piVar8;
  int in_EDX;
  int in_ESI;
  FabArrayBase *in_RDI;
  undefined8 in_XMM0_Qa;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *arr;
  Array4<const_amrex::EBCellFlag> *flagarr;
  Box *bx;
  MFIter mfi;
  int ng;
  bool is_cell_centered;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  FabArrayBase *in_stack_fffffffffffffac8;
  EBFArrayBoxFactory *in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffaf7;
  undefined4 in_stack_fffffffffffffaf8;
  int iVar9;
  undefined4 in_stack_fffffffffffffafc;
  int iVar10;
  undefined4 in_stack_fffffffffffffb00;
  int iVar11;
  undefined4 in_stack_fffffffffffffb04;
  int iVar12;
  undefined8 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  int local_448;
  int local_444;
  int local_440;
  long *local_428;
  long local_420 [8];
  long *local_3e0;
  int local_3d4 [7];
  int *local_3b8;
  MFIter local_3b0;
  int local_350;
  int local_34c;
  uint local_348;
  byte local_341;
  uint local_340;
  uint local_33c;
  FabArray<amrex::EBCellFlagFab> *local_338;
  FabArray<amrex::EBCellFlagFab> *local_330;
  undefined8 local_328;
  int local_31c;
  char *in_stack_fffffffffffffcf8;
  uint *EX;
  
  local_328 = in_XMM0_Qa;
  pFVar7 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x113f92a);
  if (pFVar7 == (FabFactory<amrex::FArrayBox> *)0x0) {
    this = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    this = (FabArray<amrex::EBCellFlagFab> *)
           __dynamic_cast(pFVar7,&FabFactory<amrex::FArrayBox>::typeinfo,
                          &EBFArrayBoxFactory::typeinfo,0);
  }
  if (this != (FabArray<amrex::EBCellFlagFab> *)0x0) {
    local_330 = this;
    local_338 = EBFArrayBoxFactory::getMultiEBCellFlagFab(in_stack_fffffffffffffad0);
    local_33c = (uint)FabArrayBase::ixType(in_stack_fffffffffffffac8);
    EX = &local_33c;
    if ((local_33c != 0) &&
       (local_340 = (uint)FabArrayBase::ixType(in_stack_fffffffffffffac8), local_340 != 7)) {
      Assert_host((char *)EX,in_stack_fffffffffffffcf8,(int)((ulong)in_RDI >> 0x20),
                  (char *)CONCAT44(in_ESI,in_EDX));
    }
    local_348 = (uint)FabArrayBase::ixType(in_stack_fffffffffffffac8);
    local_341 = local_348 == 0;
    local_350 = FabArrayBase::nGrow(in_RDI,0);
    piVar8 = std::min<int>(&local_350,&local_31c);
    local_34c = *piVar8;
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   (bool)in_stack_fffffffffffffaf7);
    while (bVar6 = MFIter::isValid(&local_3b0), bVar6) {
      MFIter::growntilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
      local_3b8 = local_3d4;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(this,(MFIter *)in_RDI);
      local_3e0 = local_420;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)this,(MFIter *)in_RDI);
      local_428 = &local_468;
      if ((local_341 & 1) == 0) {
        iVar1 = *local_3b8;
        iVar2 = local_3b8[1];
        in_stack_fffffffffffffb38 = *(undefined8 *)local_3b8;
        in_stack_fffffffffffffb40 = local_3b8[2];
        iVar3 = local_3b8[3];
        iVar4 = local_3b8[4];
        iVar5 = local_3b8[5];
        for (iVar12 = 0; iVar11 = in_stack_fffffffffffffb40, iVar12 < in_EDX; iVar12 = iVar12 + 1) {
          for (; iVar10 = iVar2, iVar11 <= iVar5; iVar11 = iVar11 + 1) {
            for (; iVar9 = iVar1, iVar10 <= iVar4; iVar10 = iVar10 + 1) {
              for (; iVar9 <= iVar3; iVar9 = iVar9 + 1) {
                if ((((((*(uint *)(*local_3e0 +
                                  ((long)((iVar9 + -1) - (int)local_3e0[4]) +
                                   (long)((iVar10 + -1) - *(int *)((long)local_3e0 + 0x24)) *
                                   local_3e0[1] +
                                  (long)((iVar11 + -1) - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3
                        ) == 3) &&
                      ((*(uint *)(*local_3e0 +
                                 ((long)(iVar9 - (int)local_3e0[4]) +
                                  (long)((iVar10 + -1) - *(int *)((long)local_3e0 + 0x24)) *
                                  local_3e0[1] +
                                 (long)((iVar11 + -1) - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3)
                       == 3)) &&
                     ((*(uint *)(*local_3e0 +
                                ((long)((iVar9 + -1) - (int)local_3e0[4]) +
                                 (long)(iVar10 - *(int *)((long)local_3e0 + 0x24)) * local_3e0[1] +
                                (long)((iVar11 + -1) - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3)
                      == 3)) &&
                    (((*(uint *)(*local_3e0 +
                                ((long)(iVar9 - (int)local_3e0[4]) +
                                 (long)(iVar10 - *(int *)((long)local_3e0 + 0x24)) * local_3e0[1] +
                                (long)((iVar11 + -1) - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3)
                      == 3 && ((*(uint *)(*local_3e0 +
                                         ((long)((iVar9 + -1) - (int)local_3e0[4]) +
                                          (long)((iVar10 + -1) - *(int *)((long)local_3e0 + 0x24)) *
                                          local_3e0[1] +
                                         (long)(iVar11 - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3
                               ) == 3)))) &&
                   (((*(uint *)(*local_3e0 +
                               ((long)(iVar9 - (int)local_3e0[4]) +
                                (long)((iVar10 + -1) - *(int *)((long)local_3e0 + 0x24)) *
                                local_3e0[1] + (long)(iVar11 - (int)local_3e0[5]) * local_3e0[2]) *
                               4) & 3) == 3 &&
                    (((*(uint *)(*local_3e0 +
                                ((long)((iVar9 + -1) - (int)local_3e0[4]) +
                                 (long)(iVar10 - *(int *)((long)local_3e0 + 0x24)) * local_3e0[1] +
                                (long)(iVar11 - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3) == 3 &&
                     ((*(uint *)(*local_3e0 +
                                ((long)(iVar9 - (int)local_3e0[4]) +
                                 (long)(iVar10 - *(int *)((long)local_3e0 + 0x24)) * local_3e0[1] +
                                (long)(iVar11 - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3) == 3)))
                    ))) {
                  *(undefined8 *)
                   (local_468 +
                   ((long)(iVar9 - local_448) + (iVar10 - local_444) * local_460 +
                    (iVar11 - local_440) * local_458 + (iVar12 + in_ESI) * local_450) * 8) =
                       local_328;
                }
              }
            }
          }
        }
      }
      else {
        iVar1 = *local_3b8;
        iVar2 = local_3b8[1];
        iVar3 = local_3b8[2];
        iVar4 = local_3b8[3];
        iVar5 = local_3b8[4];
        iVar12 = local_3b8[5];
        for (local_4ac = 0; local_4b0 = iVar3, local_4ac < in_EDX; local_4ac = local_4ac + 1) {
          for (; local_4b4 = iVar2, local_4b0 <= iVar12; local_4b0 = local_4b0 + 1) {
            for (; local_4b8 = iVar1, local_4b4 <= iVar5; local_4b4 = local_4b4 + 1) {
              for (; local_4b8 <= iVar4; local_4b8 = local_4b8 + 1) {
                if ((*(uint *)(*local_3e0 +
                              ((long)(local_4b8 - (int)local_3e0[4]) +
                               (long)(local_4b4 - *(int *)((long)local_3e0 + 0x24)) * local_3e0[1] +
                              (long)(local_4b0 - (int)local_3e0[5]) * local_3e0[2]) * 4) & 3) == 3)
                {
                  *(undefined8 *)
                   (local_468 +
                   ((long)(local_4b8 - local_448) + (local_4b4 - local_444) * local_460 +
                    (local_4b0 - local_440) * local_458 + (local_4ac + in_ESI) * local_450) * 8) =
                       local_328;
                }
              }
            }
          }
        }
      }
      MFIter::operator++(&local_3b0);
    }
    MFIter::~MFIter((MFIter *)in_RDI);
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = val;
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,val);
            });
        }
    }
}